

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

double __thiscall spvtools::opt::analysis::FloatConstant::GetDoubleValue(FloatConstant *this)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*((this->super_ScalarConstant).super_Constant.type_)->_vptr_Type[0xc])();
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 0x24) == 0x40) {
    iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    uVar1 = *(undefined4 *)(*(long *)CONCAT44(extraout_var_00,iVar2) + 4);
    iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    return (double)CONCAT44(uVar1,**(undefined4 **)CONCAT44(extraout_var_01,iVar2));
  }
  __assert_fail("type()->AsFloat()->width() == 64 && \"Not a 32-bit floating point value.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.h"
                ,0x100,"double spvtools::opt::analysis::FloatConstant::GetDoubleValue() const");
}

Assistant:

double GetDoubleValue() const {
    assert(type()->AsFloat()->width() == 64 &&
           "Not a 32-bit floating point value.");
    uint64_t combined_words = words()[1];
    combined_words = combined_words << 32;
    combined_words |= words()[0];
    utils::FloatProxy<double> a(combined_words);
    return a.getAsFloat();
  }